

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O3

int memCmp(void *buf1,void *buf2,size_t count)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  octet *b2;
  octet *b1;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  bool bVar7;
  
  if (count == 0) {
    return 0;
  }
  uVar4 = 0;
  uVar5 = 0;
  bVar1 = 0;
  bVar3 = 0;
  do {
    sVar6 = 0;
    while( true ) {
      uVar5 = (ulong)*(byte *)((long)buf1 + sVar6) | uVar5 << 8;
      uVar4 = (ulong)*(byte *)((long)buf2 + sVar6) | uVar4 << 8;
      if (sVar6 == 7) break;
      sVar6 = sVar6 + 1;
      if (count == sVar6) {
        if (sVar6 != 0) {
          bVar2 = ~bVar1 & 1;
          if (uVar4 <= uVar5) {
            bVar2 = 0;
          }
          bVar3 = bVar3 | bVar2;
          bVar2 = ~bVar3 & 1;
          if (uVar5 <= uVar4) {
            bVar2 = 0;
          }
          bVar1 = bVar1 | bVar2;
        }
        goto LAB_0010efbd;
      }
    }
    bVar2 = ~bVar1 & 1;
    if (uVar4 <= uVar5) {
      bVar2 = 0;
    }
    bVar3 = bVar3 | bVar2;
    bVar2 = ~bVar3 & 1;
    if (uVar5 <= uVar4) {
      bVar2 = 0;
    }
    bVar1 = bVar1 | bVar2;
    buf1 = (void *)((long)buf1 + 8);
    buf2 = (void *)((long)buf2 + 8);
    bVar7 = count != 8;
    count = count - 8;
  } while (bVar7);
LAB_0010efbd:
  return -(uint)bVar3 | (uint)bVar1;
}

Assistant:

int SAFE(memCmp)(const void* buf1, const void* buf2, size_t count)
{
	register word less = 0;
	register word greater = 0;
	register word w1 = 0;
	register word w2 = 0;
	const octet* b1 = (const octet*)buf1;
	const octet* b2 = (const octet*)buf2;
	size_t filled = 0;
	ASSERT(memIsValid(buf1, count));
	ASSERT(memIsValid(buf2, count));
	for (; count--; ++b1, ++b2)
	{
		w1 = w1 << 8 | *b1;
		w2 = w2 << 8 | *b2;
		if (++filled == O_PER_W)
		{
			less |= ~greater & wordLess(w1, w2);
			greater |= ~less & wordGreater(w1, w2);
			filled = 0;
		}
	}
	if (filled)
	{
		less |= ~greater & wordLess(w1, w2);
		greater |= ~less & wordGreater(w1, w2);
	}
	w1 = w2 = 0;
	return (wordEq(less, 0) - 1) | wordNeq(greater, 0);
}